

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LegendreCorrFuncZ.cpp
# Opt level: O1

int __thiscall
OpenMD::LegendreCorrFuncZ::computeProperty1(LegendreCorrFuncZ *this,int frame,StuntDouble *sd)

{
  vector<int,std::allocator<int>> *this_00;
  iterator __position;
  pointer pvVar1;
  Vector3d *pVVar2;
  uint i;
  long lVar3;
  int zBin;
  Vector3d pos;
  RotMat3x3d A;
  int local_8c;
  Vector3d local_88;
  RotMat3x3d local_70;
  
  StuntDouble::getA(&local_70,sd);
  std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
  push_back((this->rotMats_).
            super__Vector_base<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start + frame,&local_70);
  pVVar2 = (Vector3d *)
           ((long)sd->localIndex_ * 0x18 +
           *(long *)((long)&(sd->snapshotMan_->currentSnapshot_->atomData).position.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + sd->storage_));
  local_88.super_Vector<double,_3U>.data_[0] = 0.0;
  local_88.super_Vector<double,_3U>.data_[1] = 0.0;
  local_88.super_Vector<double,_3U>.data_[2] = 0.0;
  if (pVVar2 != &local_88) {
    lVar3 = 0;
    do {
      local_88.super_Vector<double,_3U>.data_[lVar3] =
           (pVVar2->super_Vector<double,_3U>).data_[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
  }
  if ((((this->super_ObjectACF<OpenMD::Vector3<double>_>).
        super_AutoCorrFunc<OpenMD::Vector3<double>_>.super_TimeCorrFunc<OpenMD::Vector3<double>_>.
       info_)->simParams_->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b == '\x01')
  {
    Snapshot::wrapVector
              ((this->super_ObjectACF<OpenMD::Vector3<double>_>).
               super_AutoCorrFunc<OpenMD::Vector3<double>_>.
               super_TimeCorrFunc<OpenMD::Vector3<double>_>.currentSnapshot_,&local_88);
  }
  local_8c = (int)(((this->halfBoxZ_ + local_88.super_Vector<double,_3U>.data_[(uint)this->axis_]) *
                   (double)this->nZBins_) / this->boxZ_);
  this_00 = (vector<int,std::allocator<int>> *)
            ((this->zbin_).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + frame);
  __position._M_current = *(int **)(this_00 + 8);
  if (__position._M_current == *(int **)(this_00 + 0x10)) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              (this_00,__position,&local_8c);
  }
  else {
    *__position._M_current = local_8c;
    *(int **)(this_00 + 8) = __position._M_current + 1;
  }
  pvVar1 = (this->rotMats_).
           super__Vector_base<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  return (int)((ulong)((long)*(pointer *)
                              ((long)&pvVar1[frame].
                                      super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                                      ._M_impl.super__Vector_impl_data + 8) -
                      *(long *)&pvVar1[frame].
                                super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                                ._M_impl.super__Vector_impl_data) >> 3) * 0x38e38e39 + -1;
}

Assistant:

int LegendreCorrFuncZ::computeProperty1(int frame, StuntDouble* sd) {
    RotMat3x3d A = sd->getA();
    rotMats_[frame].push_back(A);

    Vector3d pos = sd->getPos();
    if (info_->getSimParams()->getUsePeriodicBoundaryConditions())
      currentSnapshot_->wrapVector(pos);
    int zBin = int(nZBins_ * (halfBoxZ_ + pos[axis_]) / boxZ_);
    zbin_[frame].push_back(zBin);

    return rotMats_[frame].size() - 1;
  }